

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg2.hpp
# Opt level: O3

void __thiscall trng::mrg2::split(mrg2 *this,uint s,uint n)

{
  undefined1 auVar1 [16];
  int iVar2;
  int32_t iVar3;
  uint uVar4;
  uint i_3;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  uint i;
  uint uVar11;
  uint i_1;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  bool bVar15;
  result_type b [4];
  result_type a [2];
  int local_48;
  uint local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  if (s <= n) {
    std::invalid_argument::invalid_argument
              ((invalid_argument *)&local_48,"invalid argument for trng::mrg2::split");
    utility::throw_this<std::invalid_argument>((invalid_argument *)&local_48);
    std::invalid_argument::~invalid_argument((invalid_argument *)&local_48);
  }
  if (s < 2) {
    return;
  }
  uVar14 = (ulong)n + 1;
  if (n < 0xf) {
    uVar4 = (this->S).r[0];
    uVar5 = (this->S).r[1];
    do {
      uVar11 = uVar4;
      uVar7 = (long)(int)uVar5 * (long)(this->P).a[1] + (long)(int)uVar11 * (long)(this->P).a[0];
      uVar8 = (uVar7 >> 0x1f) + (uVar7 & 0x7fffffff);
      uVar7 = uVar8 - 0xfffffffe;
      if (uVar8 < 0xfffffffe) {
        uVar7 = uVar8;
      }
      uVar4 = (uint)uVar7 + 0x80000001;
      if (uVar7 < 0x7fffffff) {
        uVar4 = (uint)uVar7;
      }
      uVar12 = (int)uVar14 - 1;
      uVar14 = (ulong)uVar12;
      uVar5 = uVar11;
    } while (uVar12 != 0);
    (this->S).r[0] = uVar4;
    (this->S).r[1] = uVar11;
  }
  else {
    uVar4 = 0;
    do {
      if ((uVar14 & 1) != 0) {
        jump2(this,uVar4);
      }
      uVar4 = uVar4 + 1;
      bVar15 = 1 < uVar14;
      uVar14 = uVar14 >> 1;
    } while (bVar15);
    uVar4 = (this->S).r[0];
  }
  uVar14 = (ulong)s;
  if (s < 0x10) {
    uVar7 = (ulong)uVar4;
    iVar9 = (this->S).r[1];
    uVar5 = s;
    do {
      iVar2 = (int)uVar7;
      uVar7 = (long)iVar9 * (long)(this->P).a[1] + (long)iVar2 * (long)(this->P).a[0];
      uVar7 = (uVar7 >> 0x1f) + (uVar7 & 0x7fffffff);
      uVar8 = uVar7 - 0xfffffffe;
      if (uVar7 < 0xfffffffe) {
        uVar8 = uVar7;
      }
      uVar7 = (ulong)((int)uVar8 + 0x80000001);
      if (uVar8 < 0x7fffffff) {
        uVar7 = uVar8 & 0xffffffff;
      }
      uVar5 = uVar5 - 1;
      iVar9 = iVar2;
    } while (uVar5 != 0);
    (this->S).r[0] = (int)uVar7;
    (this->S).r[1] = iVar2;
  }
  else {
    uVar5 = 0;
    uVar7 = uVar14;
    do {
      if ((uVar7 & 1) != 0) {
        jump2(this,uVar5);
      }
      uVar5 = uVar5 + 1;
      bVar15 = 1 < uVar7;
      uVar7 = uVar7 >> 1;
    } while (bVar15);
    uVar7 = (ulong)(uint)(this->S).r[0];
  }
  iVar9 = (int)uVar7;
  if (s < 0x10) {
    uVar8 = uVar7;
    iVar2 = (this->S).r[1];
    uVar5 = s;
    do {
      iVar13 = (int)uVar8;
      uVar8 = (long)iVar2 * (long)(this->P).a[1] + (long)iVar13 * (long)(this->P).a[0];
      uVar8 = (uVar8 >> 0x1f) + (uVar8 & 0x7fffffff);
      uVar10 = uVar8 - 0xfffffffe;
      if (uVar8 < 0xfffffffe) {
        uVar10 = uVar8;
      }
      uVar8 = (ulong)((int)uVar10 + 0x80000001);
      if (uVar10 < 0x7fffffff) {
        uVar8 = uVar10 & 0xffffffff;
      }
      uVar5 = uVar5 - 1;
      iVar2 = iVar13;
    } while (uVar5 != 0);
    (this->S).r[0] = (int)uVar8;
    (this->S).r[1] = iVar13;
  }
  else {
    uVar5 = 0;
    uVar8 = uVar14;
    do {
      if ((uVar8 & 1) != 0) {
        jump2(this,uVar5);
      }
      uVar5 = uVar5 + 1;
      bVar15 = 1 < uVar8;
      uVar8 = uVar8 >> 1;
    } while (bVar15);
    uVar8 = (ulong)(uint)(this->S).r[0];
  }
  iVar2 = (int)uVar8;
  if (s < 0x10) {
    iVar13 = (this->S).r[1];
    do {
      iVar6 = (int)uVar8;
      uVar14 = (long)iVar13 * (long)(this->P).a[1] + (long)iVar6 * (long)(this->P).a[0];
      uVar8 = (uVar14 >> 0x1f) + (uVar14 & 0x7fffffff);
      uVar14 = uVar8 - 0xfffffffe;
      if (uVar8 < 0xfffffffe) {
        uVar14 = uVar8;
      }
      uVar8 = (ulong)((int)uVar14 + 0x80000001);
      if (uVar14 < 0x7fffffff) {
        uVar8 = uVar14 & 0xffffffff;
      }
      local_34 = (int)uVar8;
      s = s - 1;
      iVar13 = iVar6;
    } while (s != 0);
    (this->S).r[0] = local_34;
    (this->S).r[1] = iVar6;
  }
  else {
    uVar5 = 0;
    do {
      if ((uVar14 & 1) != 0) {
        jump2(this,uVar5);
      }
      uVar5 = uVar5 + 1;
      bVar15 = 1 < uVar14;
      uVar14 = uVar14 >> 1;
    } while (bVar15);
    local_34 = (this->S).r[0];
  }
  local_48 = iVar9;
  local_44 = uVar4;
  local_40 = iVar2;
  local_3c = iVar9;
  local_38 = iVar2;
  int_math::gauss<2>((int32_t (*) [4])&local_48,(int32_t (*) [2])&local_38,0x7fffffff);
  (this->P).a[0] = local_38;
  (this->P).a[1] = local_34;
  (this->S).r[0] = iVar9;
  (this->S).r[1] = uVar4;
  bVar15 = true;
  iVar9 = local_34;
  do {
    iVar2 = (this->P).a[0];
    if (iVar9 == 0) {
      iVar9 = iVar2;
      if (iVar2 != 0) goto LAB_001ffb1a;
      uVar4 = 0;
    }
    else {
      auVar1 = SEXT816((long)(int)uVar4 * (long)iVar2) * ZEXT816(0x8000000100000003);
      iVar2 = ((int)(auVar1._8_8_ >> 0x1e) - (auVar1._12_4_ >> 0x1f)) * 0x7fffffff -
              (int)((long)(int)uVar4 * (long)iVar2);
      uVar5 = (int)uVar7 + iVar2;
      uVar4 = (int)uVar7 + 0x7fffffff + iVar2;
      if (-1 < (int)uVar5) {
        uVar4 = uVar5;
      }
LAB_001ffb1a:
      iVar3 = int_math::modulo_inverse(iVar9,0x7fffffff);
      auVar1 = SEXT816((long)iVar3 * (long)(int)uVar4) * ZEXT816(0x8000000100000003);
      uVar4 = (int)((long)iVar3 * (long)(int)uVar4) +
              ((int)(auVar1._8_8_ >> 0x1e) - (auVar1._12_4_ >> 0x1f)) * -0x7fffffff;
    }
    uVar5 = (this->S).r[1];
    uVar7 = (ulong)uVar5;
    (this->S).r[0] = uVar5;
    (this->S).r[1] = uVar4;
    if (!bVar15) {
      return;
    }
    iVar9 = (this->P).a[1];
    bVar15 = false;
  } while( true );
}

Assistant:

TRNG_CUDA_ENABLE
  inline void mrg2::split(unsigned int s, unsigned int n) {
#if !(defined TRNG_CUDA)
    if (s < 1 or n >= s)
      utility::throw_this(std::invalid_argument("invalid argument for trng::mrg2::split"));
#endif
    if (s > 1) {
      jump(n + 1ull);
      const result_type q0{S.r[0]};
      jump(s);
      const result_type q1{S.r[0]};
      jump(s);
      const result_type q2{S.r[0]};
      jump(s);
      const result_type q3{S.r[0]};
      result_type a[2], b[4];
      a[0] = q2;
      b[0] = q1;
      b[1] = q0;
      a[1] = q3;
      b[2] = q2;
      b[3] = q1;
      int_math::gauss<2>(b, a, modulus);
      P.a[0] = a[0];
      P.a[1] = a[1];
      S.r[0] = q1;
      S.r[1] = q0;
      for (int i{0}; i < 2; ++i)
        backward();
    }
  }